

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptor::DebugString(FieldDescriptor *this,int depth,string *contents)

{
  FieldDescriptor FVar1;
  bool bVar2;
  size_t sVar3;
  FieldDescriptor *pFVar4;
  string formatted_options;
  string field_type;
  string prefix;
  string local_200;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  field_type._M_dataplus._M_p = (pointer)&field_type.field_2;
  field_type._M_string_length = 0;
  field_type.field_2._M_local_buf[0] = '\0';
  if (*(int *)(this + 0x2c) == 0xb) {
    std::operator+(&formatted_options,".",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (*(long *)(this + 0x48) + 8));
LAB_001e00f2:
    std::__cxx11::string::operator=((string *)&field_type,(string *)&formatted_options);
    std::__cxx11::string::~string((string *)&formatted_options);
  }
  else {
    if (*(int *)(this + 0x2c) == 0xe) {
      std::operator+(&formatted_options,".",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (*(long *)(this + 0x50) + 8));
      goto LAB_001e00f2;
    }
    std::__cxx11::string::assign((char *)&field_type);
  }
  formatted_options._M_dataplus = prefix._M_dataplus;
  formatted_options._M_string_length =
       CONCAT44(formatted_options._M_string_length._4_4_,(undefined4)prefix._M_string_length);
  local_120.text_ = *(char **)(kLabelToName + (ulong)*(uint *)(this + 0x30) * 8);
  sVar3 = strlen(local_120.text_);
  local_120.size_ = (int)sVar3;
  local_150.text_ = field_type._M_dataplus._M_p;
  local_150.size_ = (int)field_type._M_string_length;
  pFVar4 = this;
  if (*(int *)(this + 0x2c) == 10) {
    pFVar4 = *(FieldDescriptor **)(this + 0x48);
  }
  local_180.text_ = (char *)**(undefined8 **)pFVar4;
  local_180.size_ = *(int *)(*(undefined8 **)pFVar4 + 1);
  strings::internal::SubstituteArg::SubstituteArg(&local_1b0,*(int *)(this + 0x28));
  local_1e0.text_ = (char *)0x0;
  local_1e0.size_ = -1;
  local_60.text_ = (char *)0x0;
  local_60.size_ = -1;
  local_90.text_ = (char *)0x0;
  local_90.size_ = -1;
  local_c0.text_ = (char *)0x0;
  local_c0.size_ = -1;
  local_f0.text_ = (char *)0x0;
  local_f0.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0$1 $2 $3 = $4",(SubstituteArg *)&formatted_options,&local_120,&local_150,
             &local_180,&local_1b0,&local_1e0,&local_60,&local_90,&local_c0,&local_f0);
  FVar1 = this[0x68];
  if (FVar1 == (FieldDescriptor)0x1) {
    DefaultValueAsString_abi_cxx11_(&local_200,this,true);
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (pointer)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    formatted_options._M_dataplus._M_p = local_200._M_dataplus._M_p;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    formatted_options._M_string_length =
         CONCAT44(formatted_options._M_string_length._4_4_,(undefined4)local_200._M_string_length);
    local_f0.size_ = -1;
    strings::SubstituteAndAppend
              (contents," [default = $0",(SubstituteArg *)&formatted_options,&local_120,&local_150,
               &local_180,&local_1b0,&local_1e0,&local_60,&local_90,&local_c0,&local_f0);
    std::__cxx11::string::~string((string *)&local_200);
  }
  formatted_options._M_dataplus._M_p = (pointer)&formatted_options.field_2;
  formatted_options._M_string_length = 0;
  formatted_options.field_2._M_local_buf[0] = '\0';
  bVar2 = anon_unknown_1::FormatBracketedOptions
                    (depth,*(Message **)(this + 0x60),&formatted_options);
  if (bVar2) {
    std::__cxx11::string::append((char *)contents);
    std::__cxx11::string::append((string *)contents);
  }
  else if (FVar1 == (FieldDescriptor)0x0) goto LAB_001e03b7;
  std::__cxx11::string::append((char *)contents);
LAB_001e03b7:
  if (*(int *)(this + 0x2c) == 10) {
    Descriptor::DebugString(*(Descriptor **)(this + 0x48),depth,contents);
  }
  else {
    std::__cxx11::string::append((char *)contents);
  }
  std::__cxx11::string::~string((string *)&formatted_options);
  std::__cxx11::string::~string((string *)&field_type);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void FieldDescriptor::DebugString(int depth, string *contents) const {
  string prefix(depth * 2, ' ');
  string field_type;
  switch (type()) {
    case TYPE_MESSAGE:
      field_type = "." + message_type()->full_name();
      break;
    case TYPE_ENUM:
      field_type = "." + enum_type()->full_name();
      break;
    default:
      field_type = kTypeToName[type()];
  }

  strings::SubstituteAndAppend(contents, "$0$1 $2 $3 = $4",
                               prefix,
                               kLabelToName[label()],
                               field_type,
                               type() == TYPE_GROUP ? message_type()->name() :
                                                      name(),
                               number());

  bool bracketed = false;
  if (has_default_value()) {
    bracketed = true;
    strings::SubstituteAndAppend(contents, " [default = $0",
                                 DefaultValueAsString(true));
  }

  string formatted_options;
  if (FormatBracketedOptions(depth, options(), &formatted_options)) {
    contents->append(bracketed ? ", " : " [");
    bracketed = true;
    contents->append(formatted_options);
  }

  if (bracketed) {
    contents->append("]");
  }

  if (type() == TYPE_GROUP) {
    message_type()->DebugString(depth, contents);
  } else {
    contents->append(";\n");
  }
}